

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Storage.cpp
# Opt level: O0

void __thiscall
CPU::Z80::ProcessorStorage::assemble_fetch_decode_execute
          (ProcessorStorage *this,InstructionPage *target,int length)

{
  MicroOp *pMVar1;
  undefined4 *local_378;
  HalfCycles local_328;
  HalfCycles local_320;
  HalfCycles local_318;
  HalfCycles local_310;
  undefined4 local_308 [2];
  MicroOp short_fetch_decode_execute [5];
  HalfCycles local_1c0;
  HalfCycles local_1b8;
  HalfCycles local_1b0;
  undefined4 local_1a8 [2];
  MicroOp normal_fetch_decode_execute [6];
  int length_local;
  InstructionPage *target_local;
  ProcessorStorage *this_local;
  
  local_1a8[0] = 0;
  normal_fetch_decode_execute[0].type = BusOperation;
  normal_fetch_decode_execute[0]._4_4_ = 0;
  normal_fetch_decode_execute[0].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1b0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[0].destination,ReadOpcodeStart,
             local_1b0,&(this->pc_).full,&this->operation_,false);
  normal_fetch_decode_execute[0].machine_cycle.was_requested = false;
  normal_fetch_decode_execute[0].machine_cycle._33_3_ = 0;
  normal_fetch_decode_execute[1].type = BusOperation;
  normal_fetch_decode_execute[1]._4_4_ = 0;
  normal_fetch_decode_execute[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1b8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[1].destination,ReadOpcodeWait,
             local_1b8,&(this->pc_).full,&this->operation_,true);
  normal_fetch_decode_execute[1].machine_cycle.was_requested = false;
  normal_fetch_decode_execute[1].machine_cycle._33_3_ = 0;
  normal_fetch_decode_execute[2].type = BusOperation;
  normal_fetch_decode_execute[2]._4_4_ = 0;
  normal_fetch_decode_execute[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1c0,1);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[2].destination,ReadOpcode,local_1c0
             ,&(this->pc_).full,&this->operation_,false);
  normal_fetch_decode_execute[2].machine_cycle.was_requested = true;
  normal_fetch_decode_execute[2].machine_cycle._33_3_ = 0;
  normal_fetch_decode_execute[3].type = BusOperation;
  normal_fetch_decode_execute[3]._4_4_ = 0;
  normal_fetch_decode_execute[3].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[3].destination);
  normal_fetch_decode_execute[3].machine_cycle.was_requested = false;
  normal_fetch_decode_execute[3].machine_cycle._33_3_ = 0;
  normal_fetch_decode_execute[4].type = BusOperation;
  normal_fetch_decode_execute[4]._4_4_ = 0;
  normal_fetch_decode_execute[4].source = (void *)0x0;
  HalfCycles::HalfCycles((HalfCycles *)&short_fetch_decode_execute[4].machine_cycle.was_requested,4)
  ;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[4].destination,Refresh,
             (HalfCycles)short_fetch_decode_execute[4].machine_cycle._32_8_,
             &(this->refresh_addr_).full,(uint8_t *)0x0,false);
  normal_fetch_decode_execute[4].machine_cycle.was_requested = true;
  normal_fetch_decode_execute[4].machine_cycle._33_3_ = 0;
  normal_fetch_decode_execute[5].type = BusOperation;
  normal_fetch_decode_execute[5]._4_4_ = 0;
  normal_fetch_decode_execute[5].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&normal_fetch_decode_execute[5].destination);
  local_308[0] = 0;
  short_fetch_decode_execute[0].type = BusOperation;
  short_fetch_decode_execute[0]._4_4_ = 0;
  short_fetch_decode_execute[0].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_310,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&short_fetch_decode_execute[0].destination,ReadStart,local_310,
             &(this->pc_).full,&this->operation_,false);
  short_fetch_decode_execute[0].machine_cycle.was_requested = false;
  short_fetch_decode_execute[0].machine_cycle._33_3_ = 0;
  short_fetch_decode_execute[1].type = BusOperation;
  short_fetch_decode_execute[1]._4_4_ = 0;
  short_fetch_decode_execute[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_318,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&short_fetch_decode_execute[1].destination,ReadWait,local_318,
             &(this->pc_).full,&this->operation_,true);
  short_fetch_decode_execute[1].machine_cycle.was_requested = false;
  short_fetch_decode_execute[1].machine_cycle._33_3_ = 0;
  short_fetch_decode_execute[2].type = BusOperation;
  short_fetch_decode_execute[2]._4_4_ = 0;
  short_fetch_decode_execute[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_320,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&short_fetch_decode_execute[2].destination,Read,local_320,
             &(this->pc_).full,&this->operation_,false);
  short_fetch_decode_execute[2].machine_cycle.was_requested = false;
  short_fetch_decode_execute[2].machine_cycle._33_3_ = 0;
  short_fetch_decode_execute[3].type = BusOperation;
  short_fetch_decode_execute[3]._4_4_ = 0;
  short_fetch_decode_execute[3].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_328,4);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&short_fetch_decode_execute[3].destination,Internal,local_328,
             &this->last_address_bus_,(uint8_t *)0x0,false);
  short_fetch_decode_execute[3].machine_cycle.was_requested = true;
  short_fetch_decode_execute[3].machine_cycle._33_3_ = 0;
  short_fetch_decode_execute[4].type = BusOperation;
  short_fetch_decode_execute[4]._4_4_ = 0;
  short_fetch_decode_execute[4].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&short_fetch_decode_execute[4].destination);
  if (length == 4) {
    local_378 = local_1a8;
  }
  else {
    local_378 = local_308;
  }
  (*this->_vptr_ProcessorStorage[1])(this,local_378,&target->fetch_decode_execute);
  pMVar1 = std::
           vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
           ::data(&target->fetch_decode_execute);
  target->fetch_decode_execute_data = pMVar1;
  return;
}

Assistant:

void ProcessorStorage::assemble_fetch_decode_execute(InstructionPage &target, int length) {
	/// The fetch-decode-execute sequence for a regular four-clock M1 cycle.
	const MicroOp normal_fetch_decode_execute[] = {
		BusOp(ReadOpcodeStart()),
		BusOp(ReadOpcodeWait(true)),
		BusOp(ReadOpcodeEnd()),
		{ MicroOp::IncrementR },
		BusOp(Refresh()),
		{ MicroOp::DecodeOperation }
	};

	/// The concluding fetch-decode-execute of a [dd/fd]cb nn oo sequence, i.e. an (IX+n) or (IY+n) operation.
	/// Per the observed 48kb/128kb Spectrum timings, this appears not to include a refresh cycle. So I've also
	/// taken a punt on it not incrementing R.
	const MicroOp short_fetch_decode_execute[] = {
		BusOp(ReadStart(pc_, operation_)),
		BusOp(ReadWait(pc_, operation_)),
		BusOp(ReadEnd(pc_, operation_)),
		InternalOperation(4),
		{ MicroOp::DecodeOperation },
	};

	copy_program((length == 4) ? normal_fetch_decode_execute : short_fetch_decode_execute, target.fetch_decode_execute);
	target.fetch_decode_execute_data = target.fetch_decode_execute.data();
}